

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cfg_structurizer.cpp
# Opt level: O3

void __thiscall dxil_spv::CFGStructurizer::backwards_visit(CFGStructurizer *this,CFGNode *entry)

{
  pointer *pppCVar1;
  pointer ppCVar2;
  iterator __position;
  pointer ppCVar3;
  CFGNode *local_28;
  
  entry->backward_visited = true;
  ppCVar2 = (entry->pred).
            super__Vector_base<dxil_spv::CFGNode_*,_dxil_spv::ThreadLocalAllocator<dxil_spv::CFGNode_*>_>
            ._M_impl.super__Vector_impl_data._M_finish;
  for (ppCVar3 = (entry->pred).
                 super__Vector_base<dxil_spv::CFGNode_*,_dxil_spv::ThreadLocalAllocator<dxil_spv::CFGNode_*>_>
                 ._M_impl.super__Vector_impl_data._M_start; ppCVar3 != ppCVar2;
      ppCVar3 = ppCVar3 + 1) {
    if ((*ppCVar3)->backward_visited == false) {
      backwards_visit(this,*ppCVar3);
    }
  }
  ppCVar2 = (entry->fake_pred).
            super__Vector_base<dxil_spv::CFGNode_*,_dxil_spv::ThreadLocalAllocator<dxil_spv::CFGNode_*>_>
            ._M_impl.super__Vector_impl_data._M_finish;
  for (ppCVar3 = (entry->fake_pred).
                 super__Vector_base<dxil_spv::CFGNode_*,_dxil_spv::ThreadLocalAllocator<dxil_spv::CFGNode_*>_>
                 ._M_impl.super__Vector_impl_data._M_start; ppCVar3 != ppCVar2;
      ppCVar3 = ppCVar3 + 1) {
    if ((*ppCVar3)->backward_visited == false) {
      backwards_visit(this,*ppCVar3);
    }
  }
  __position._M_current =
       (this->backward_post_visit_order).
       super__Vector_base<dxil_spv::CFGNode_*,_dxil_spv::ThreadLocalAllocator<dxil_spv::CFGNode_*>_>
       ._M_impl.super__Vector_impl_data._M_finish;
  entry->backward_post_visit_order =
       (uint32_t)
       ((ulong)((long)__position._M_current -
               (long)(this->backward_post_visit_order).
                     super__Vector_base<dxil_spv::CFGNode_*,_dxil_spv::ThreadLocalAllocator<dxil_spv::CFGNode_*>_>
                     ._M_impl.super__Vector_impl_data._M_start) >> 3);
  if (__position._M_current ==
      (this->backward_post_visit_order).
      super__Vector_base<dxil_spv::CFGNode_*,_dxil_spv::ThreadLocalAllocator<dxil_spv::CFGNode_*>_>.
      _M_impl.super__Vector_impl_data._M_end_of_storage) {
    local_28 = entry;
    std::vector<dxil_spv::CFGNode*,dxil_spv::ThreadLocalAllocator<dxil_spv::CFGNode*>>::
    _M_realloc_insert<dxil_spv::CFGNode*>
              ((vector<dxil_spv::CFGNode*,dxil_spv::ThreadLocalAllocator<dxil_spv::CFGNode*>> *)
               &this->backward_post_visit_order,__position,&local_28);
  }
  else {
    *__position._M_current = entry;
    pppCVar1 = &(this->backward_post_visit_order).
                super__Vector_base<dxil_spv::CFGNode_*,_dxil_spv::ThreadLocalAllocator<dxil_spv::CFGNode_*>_>
                ._M_impl.super__Vector_impl_data._M_finish;
    *pppCVar1 = *pppCVar1 + 1;
  }
  return;
}

Assistant:

void CFGStructurizer::backwards_visit(CFGNode &entry)
{
	entry.backward_visited = true;

	for (auto *pred : entry.pred)
		if (!pred->backward_visited)
			backwards_visit(*pred);

	for (auto *pred : entry.fake_pred)
		if (!pred->backward_visited)
			backwards_visit(*pred);

	entry.backward_post_visit_order = backward_post_visit_order.size();
	backward_post_visit_order.push_back(&entry);
}